

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.c
# Opt level: O0

Color trace_ray(Scene *sc,Ray r,int depth,Sampler *sampler)

{
  Intersect it_00;
  Color CVar1;
  int local_84;
  undefined1 auStack_80 [4];
  int i;
  Intersect it;
  Sampler *sampler_local;
  int depth_local;
  Scene *sc_local;
  undefined4 uStack_10;
  Color rval;
  
  i = i & 0xffffff00;
  it.normal.y = INFINITY;
  sampler->current_depth = (long)depth;
  auStack_80 = (undefined1  [4])depth;
  it.material = (Material *)sampler;
  it.sampler = sampler;
  for (local_84 = 0; (ulong)(long)local_84 < sc->object_count; local_84 = local_84 + 1) {
    intersect_object(sc->objects[local_84],r,(Intersect *)auStack_80);
  }
  if ((i & 1U) == 0) {
    CVar1 = gray(0.0);
    rval.r = CVar1.b;
    unique0x100000e9 = CVar1._0_8_;
  }
  else {
    it_00._4_4_ = i;
    it_00.depth = (int)auStack_80;
    it_00.outgoing.x = it.normal.z;
    it_00.t = it.normal.y;
    it_00.point._0_8_ = it._0_8_;
    it_00.point.z = it.point.x;
    it_00.normal.x = it.point.y;
    it_00.normal.y = it.point.z;
    it_00.normal.z = it.normal.x;
    it_00.outgoing.y = it.t;
    it_00.outgoing.z = it.outgoing.x;
    it_00.outgoing_radiance.r = it.outgoing.y;
    it_00.outgoing_radiance.g = it.outgoing.z;
    it_00.outgoing_radiance.b = it.outgoing_radiance.r;
    it_00._60_4_ = it.outgoing_radiance.g;
    it_00.material = (Material *)it._56_8_;
    it_00.sampler = (Sampler *)it.material;
    CVar1 = shade(it_00,sc);
    rval.r = CVar1.b;
    unique0x100000e1 = CVar1._0_8_;
  }
  CVar1.b = rval.r;
  CVar1.r = (float)sc_local._4_4_;
  CVar1.g = (float)uStack_10;
  return CVar1;
}

Assistant:

Color trace_ray(Scene* sc, Ray r, int depth, Sampler* sampler) {
    Intersect it;
    it.hit = false;
    it.t = INFINITY;
    it.depth = depth;
    it.sampler = sampler;
    sampler->current_depth = depth;

    for (int i = 0; i < sc->object_count; i++) {
        intersect_object(sc->objects[i], r, &it);
    }

    Color rval;

    if (it.hit) {
        rval = shade(it, sc);
    } else {
        rval = gray(0.0f); // @Todo : color constants
    }
    return rval;
}